

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_sync(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  int iVar3;
  int extraout_EAX_01;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr_00;
  char *pcVar6;
  char *__s1;
  undefined4 uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong *puVar10;
  ulong uVar11;
  uLong auStack_1d0 [2];
  undefined1 *puStack_1c0;
  char *pcStack_1b8;
  ulong uStack_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_188;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  uLong uStack_148;
  char *pcStack_138;
  undefined1 *puStack_130;
  code *pcStack_128;
  char *pcStack_120;
  int iStack_118;
  undefined1 *puStack_108;
  undefined4 uStack_100;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  uLong uStack_c0;
  Byte *pBStack_b0;
  uLong uStack_a8;
  code *pcStack_a0;
  Byte *local_90;
  uint local_88;
  Byte *local_78;
  undefined4 local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  local_88 = 2;
  pcVar8 = "1.2.8";
  pcStack_a0 = (code *)0x103362;
  local_90 = compr;
  iVar1 = inflateInit_(&local_90,"1.2.8",0x70);
  if (iVar1 == 0) {
    local_70 = (undefined4)uncomprLen;
    pcVar8 = (char *)0x0;
    pcStack_a0 = (code *)0x10337f;
    local_78 = uncompr;
    inflate(&local_90);
    local_88 = (int)comprLen - 2;
    comprLen = (uLong)local_88;
    pcStack_a0 = (code *)0x103390;
    iVar1 = inflateSync(&local_90);
    if (iVar1 != 0) goto LAB_001033da;
    pcVar8 = (char *)0x4;
    pcStack_a0 = (code *)0x1033a3;
    iVar1 = inflate(&local_90);
    if (iVar1 != -3) goto LAB_001033e1;
    pcStack_a0 = (code *)0x1033b2;
    uVar2 = inflateEnd(&local_90);
    if (uVar2 == 0) {
      pcStack_a0 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",uncompr);
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_a0 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_a0 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar2 = extraout_EAX;
  }
  puVar10 = (ulong *)(ulong)uVar2;
  pcStack_a0 = test_dict_deflate;
  test_sync_cold_4();
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uVar7 = 9;
  pcVar6 = (char *)0x70;
  pcStack_128 = (code *)0x103424;
  pBStack_b0 = uncompr;
  uStack_a8 = comprLen;
  pcStack_a0 = (code *)uncomprLen;
  iVar1 = deflateInit_(&pcStack_120,9,"1.2.8");
  if (iVar1 == 0) {
    uVar7 = 0x104004;
    pcStack_128 = (code *)0x10343c;
    iVar1 = deflateSetDictionary(&pcStack_120,"hello",6);
    if (iVar1 != 0) goto LAB_0010349a;
    dictId = uStack_c0;
    uStack_100 = SUB84(pcVar8,0);
    pcStack_120 = hello;
    pcStack_128 = (code *)0x103465;
    puStack_108 = (undefined1 *)puVar10;
    sVar4 = strlen(hello);
    iStack_118 = (int)sVar4 + 1;
    uVar7 = 4;
    pcStack_128 = (code *)0x103478;
    iVar1 = deflate(&pcStack_120);
    uncomprLen = (uLong)&pcStack_120;
    if (iVar1 != 1) goto LAB_001034a1;
    pcStack_128 = (code *)0x103485;
    uVar2 = deflateEnd(&pcStack_120);
    uncomprLen = (uLong)&pcStack_120;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_128 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_128 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_128 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_00;
  }
  uVar11 = (ulong)uVar2;
  pcStack_128 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_168 = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  pcVar9 = "1.2.8";
  uStack_1a8 = uVar11;
  uStack_1a0 = uVar7;
  pcStack_138 = pcVar8;
  puStack_130 = (undefined1 *)puVar10;
  pcStack_128 = (code *)uncomprLen;
  iVar1 = inflateInit_(&uStack_1a8,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_188 = SUB84(pcVar6,0);
    pcVar6 = "hello";
    do {
      pcVar9 = (char *)0x0;
      iVar1 = inflate(&uStack_1a8);
      if (iVar1 == 2) {
        if (uStack_148 != dictId) {
          test_dict_inflate_cold_2();
          puVar10 = &uStack_1a8;
          goto LAB_0010358d;
        }
        pcVar9 = "hello";
        iVar1 = inflateSetDictionary(&uStack_1a8,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_0010354e:
    iVar1 = inflateEnd(&uStack_1a8);
    puVar10 = &uStack_1a8;
    if (iVar1 == 0) {
      pcVar9 = hello;
      pcVar8 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar8;
      puVar10 = &uStack_1a8;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_01;
  }
  test_dict_inflate_cold_3();
LAB_0010359b:
  test_dict_inflate_cold_4();
  auStack_1d0[0] = 40000;
  puStack_1c0 = (undefined1 *)puVar10;
  pcStack_1b8 = pcVar6;
  pcVar8 = (char *)zlibVersion();
  if (*pcVar8 == '1') {
    pcVar8 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar8,"1.2.8");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr_00,40000);
      if (iVar1 < 2) {
        pcVar8 = "foo.gz";
      }
      else {
        pcVar8 = *(char **)(pcVar9 + 8);
      }
      test_gzio(pcVar8,uncompr_00,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr_00,40000);
      test_large_deflate(compr_00,40000,uncompr_00,40000);
      test_large_inflate(compr_00,40000,uncompr_00,40000);
      test_flush(compr_00,auStack_1d0);
      test_sync(compr_00,auStack_1d0[0],uncompr_00,40000);
      auStack_1d0[0] = 40000;
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr_00,40000);
      free(compr_00);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_sync(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = 2; /* just read the zlib header */

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uInt)uncomprLen;

    inflate(&d_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "inflate");

    d_stream.avail_in = (uInt)comprLen-2;   /* read all compressed data */
    err = inflateSync(&d_stream);           /* but skip the damaged part */
    CHECK_ERR(err, "inflateSync");

    err = inflate(&d_stream, Z_FINISH);
    if (err != Z_DATA_ERROR) {
        fprintf(stderr, "inflate should report DATA_ERROR\n");
        /* Because of incorrect adler32 */
        exit(1);
    }
    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    printf("after inflateSync(): hel%s\n", (char *)uncompr);
}